

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

int __thiscall
ncnn::Split::forward
          (Split *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *param_4)

{
  int iVar1;
  int *piVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_t i;
  Mat *bottom_blob;
  ulong local_68;
  
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  for (local_68 = 0; sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX),
      local_68 < sVar4; local_68 = local_68 + 1) {
    pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,local_68);
    if (pvVar5 != pvVar3) {
      if (pvVar3->refcount != (int *)0x0) {
        LOCK();
        *pvVar3->refcount = *pvVar3->refcount + 1;
        UNLOCK();
      }
      if (pvVar5->refcount != (int *)0x0) {
        piVar2 = pvVar5->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (pvVar5->allocator == (Allocator *)0x0) {
            if (pvVar5->data != (void *)0x0) {
              free(pvVar5->data);
            }
          }
          else {
            (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
          }
        }
      }
      pvVar5->data = (void *)0x0;
      pvVar5->elemsize = 0;
      pvVar5->elempack = 0;
      pvVar5->dims = 0;
      pvVar5->w = 0;
      pvVar5->h = 0;
      pvVar5->d = 0;
      pvVar5->c = 0;
      pvVar5->cstep = 0;
      pvVar5->refcount = (int *)0x0;
      pvVar5->data = pvVar3->data;
      pvVar5->refcount = pvVar3->refcount;
      pvVar5->elemsize = pvVar3->elemsize;
      pvVar5->elempack = pvVar3->elempack;
      pvVar5->allocator = pvVar3->allocator;
      pvVar5->dims = pvVar3->dims;
      pvVar5->w = pvVar3->w;
      pvVar5->h = pvVar3->h;
      pvVar5->d = pvVar3->d;
      pvVar5->c = pvVar3->c;
      pvVar5->cstep = pvVar3->cstep;
    }
  }
  return 0;
}

Assistant:

int Split::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& /*opt*/) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    for (size_t i = 0; i < top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blob;
    }

    return 0;
}